

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal<char_const(&)[97],std::__cxx11::string_const&,char_const*,unsigned_int&,char_const(&)[7],std::__cxx11::string>
          (Reporter *this,ReturnCode return_code,char (*args) [97],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char **args_2,
          uint *args_3,char (*args_4) [7],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  format_string<const_std::__cxx11::basic_string<char>_&,_const_char_*,_unsigned_int_&,_const_char_(&)[7],_std::__cxx11::basic_string<char>_>
  fmt;
  char *pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  size_t in_RDI;
  char **in_R8;
  uint *in_R9;
  undefined8 in_stack_00000008;
  FatalError *in_stack_00000010;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  char **ppcVar3;
  ostream *in_stack_ffffffffffffff10;
  basic_string_view<char> in_stack_ffffffffffffff18;
  char *local_d8 [2];
  char local_c8 [8];
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  undefined4 in_stack_ffffffffffffff78;
  char (*args_3_00) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4_00;
  
  local_b8 = "{} fatal: ";
  local_b0 = std::char_traits<char>::length((char_type *)0x204014);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff10,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff08);
  args_3_00 = (char (*) [7])local_c8;
  args_4_00 = in_RDX;
  local_c0 = std::char_traits<char>::length((char_type *)0x2040b2);
  fmt.str_.data_._4_4_ = in_ESI;
  fmt.str_.data_._0_4_ = in_stack_ffffffffffffff78;
  fmt.str_.size_ = in_RDI;
  ::fmt::v10::
  print<std::__cxx11::string_const&,char_const*,unsigned_int&,char_const(&)[7],std::__cxx11::string>
            ((ostream *)in_RDX,fmt,in_RCX,in_R8,in_R9,args_3_00,args_4_00);
  ppcVar3 = local_d8;
  local_d8[0] = "\n";
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x204175);
  this_00 = in_stack_00000010;
  ppcVar3[1] = pcVar1;
  ::fmt::v10::print<>(in_stack_ffffffffffffff10,(format_string<>)in_stack_ffffffffffffff18);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,in_stack_00000008._4_4_);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }